

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

BigInt * __thiscall BigInt::operator%=(BigInt *this,BigInt *b)

{
  BigInt local_30;
  
  operator%(&local_30,this,b);
  operator=(this,&local_30);
  if (local_30.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

BigInt& BigInt::operator%=(BigInt&& b) {
    *this = *this % b;
    return *this;
}